

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O2

void luaF_initupvals(lua_State *L,LClosure *cl)

{
  UpVal *pUVar1;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < cl->nupvalues; uVar2 = uVar2 + 1) {
    pUVar1 = (UpVal *)luaM_realloc_(L,(void *)0x0,0,0x20);
    pUVar1->refcount = 1;
    pUVar1->v = (TValue *)&pUVar1->u;
    (pUVar1->u).open.touched = 0;
    cl->upvals[uVar2] = pUVar1;
  }
  return;
}

Assistant:

void luaF_initupvals(lua_State *L, LClosure *cl) {
    int i;
    for (i = 0; i < cl->nupvalues; i++) {
        UpVal *uv = luaM_new(L, UpVal);
        uv->refcount = 1;
        uv->v = &uv->u.value;  /* make it closed */
        setnilvalue(uv->v);
        cl->upvals[i] = uv;
    }
}